

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

int message_get_body_amqp_sequence_count(MESSAGE_HANDLE message,size_t *count)

{
  MESSAGE_BODY_TYPE MVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  MESSAGE_BODY_TYPE body_type;
  LOGGER_LOG l;
  int result;
  size_t *count_local;
  MESSAGE_HANDLE message_local;
  
  if ((message == (MESSAGE_HANDLE)0x0) || (count == (size_t *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                ,"message_get_body_amqp_sequence_count",0x56c,1,
                "Bad arguments: message = %p, count = %p",message,count);
    }
    l._4_4_ = 0x56d;
  }
  else {
    MVar1 = internal_get_body_type(message);
    if (MVar1 == MESSAGE_BODY_TYPE_SEQUENCE) {
      *count = message->body_amqp_sequence_count;
      l._4_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                  ,"message_get_body_amqp_sequence_count",0x575,1,"Body is not of type SEQUENCE");
      }
      l._4_4_ = 0x576;
    }
  }
  return l._4_4_;
}

Assistant:

int message_get_body_amqp_sequence_count(MESSAGE_HANDLE message, size_t* count)
{
    int result;

    if ((message == NULL) ||
        (count == NULL))
    {
        /* Codes_SRS_MESSAGE_01_123: [ If `message` or `count` is NULL, `message_get_body_amqp_sequence_count` shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: message = %p, count = %p",
            message, count);
        result = MU_FAILURE;
    }
    else
    {
        MESSAGE_BODY_TYPE body_type = internal_get_body_type(message);
        if (body_type != MESSAGE_BODY_TYPE_SEQUENCE)
        {
            /* Codes_SRS_MESSAGE_01_124: [ If the body for `message` is not of type `MESSAGE_BODY_TYPE_SEQUENCE`, `message_get_body_amqp_sequence_count` shall fail and return a non-zero value. ]*/
            LogError("Body is not of type SEQUENCE");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_MESSAGE_01_121: [ `message_get_body_amqp_sequence_count` shall fill in `count` the number of AMQP sequences that are stored by the message identified by `message`. ]*/
            *count = message->body_amqp_sequence_count;

            /* Codes_SRS_MESSAGE_01_122: [ On success, `message_get_body_amqp_sequence_count` shall return 0. ]*/
            result = 0;
        }
    }

    return result;
}